

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_segtree_test.cpp
# Opt level: O2

Naive * __thiscall Naive::rangeUpdate(Naive *this,int fr,int to,ll x)

{
  long *plVar1;
  vector<long_long,_std::allocator<long_long>_> *this_00;
  long lVar2;
  
  this_00 = (vector<long_long,_std::allocator<long_long>_> *)operator_new(0x18);
  Naive((Naive *)this_00,
        (int)((ulong)((long)(this->vals).super__Vector_base<long_long,_std::allocator<long_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->vals).super__Vector_base<long_long,_std::allocator<long_long>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3));
  std::vector<long_long,_std::allocator<long_long>_>::operator=(this_00,&this->vals);
  for (lVar2 = (long)fr; lVar2 < to; lVar2 = lVar2 + 1) {
    plVar1 = (this_00->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
             super__Vector_impl_data._M_start + lVar2;
    *plVar1 = *plVar1 + x;
  }
  return (Naive *)this_00;
}

Assistant:

Naive* rangeUpdate(int fr, int to, ll x) const {
        auto res = new Naive(vals.size());
        res->vals = vals;
        rep(i, fr, to) {
            res->vals[i] += x;
        }
        return res;
    }